

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_pushdown.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownJoin
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  void *pvVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  int iVar4;
  pointer pLVar5;
  pointer pLVar6;
  reference pvVar7;
  type pLVar8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> result;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  right_bindings;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  left_bindings;
  ClientContext *local_120;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_118;
  LogicalOperator *local_110;
  LogicalOperator *local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  pointer local_d8;
  __node_base _Stack_d0;
  __node_base_ptr local_c8;
  void *local_b8;
  __node_base _Stack_b0;
  pointer local_a8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_98;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  iVar4 = (*pLVar5->_vptr_LogicalOperator[0xc])(pLVar5);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pLVar5[1].type);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &pLVar5[1].children.
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  local_98._M_buckets = &local_98._M_single_bucket;
  local_98._M_bucket_count = (size_type)&DAT_00000001;
  local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_element_count = 0;
  local_98._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_rehash_policy._M_next_resize = 0;
  local_98._M_single_bucket = (__node_base_ptr)0x0;
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](&pLVar6->children,0);
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar7);
  LogicalJoin::GetTableReferences
            (pLVar8,(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&local_60);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](&pLVar6->children,1);
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar7);
  LogicalJoin::GetTableReferences
            (pLVar8,(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&local_98);
  local_118._M_head_impl = (LogicalOperator *)0x0;
  switch(pLVar5->field_0x61) {
  case 1:
    local_f0._0_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownLeftJoin((FilterPushdown *)&local_120,op,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_f0,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&local_60);
    _Var3._M_head_impl = local_118._M_head_impl;
    local_118._M_head_impl = (LogicalOperator *)local_120;
    local_120 = (ClientContext *)0x0;
    if ((ClientContext *)_Var3._M_head_impl != (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                   &(_Var3._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (local_120 != (ClientContext *)0x0) {
      (*(code *)((*(ClientContext **)
                   &local_120->super_enable_shared_from_this<duckdb::ClientContext>)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    local_120 = (ClientContext *)0x0;
    if ((LogicalOperator *)local_f0._0_8_ != (LogicalOperator *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_f0._0_8_)[1]._M_nxt)();
    }
    local_f0._0_8_ = (_Hash_node_base *)0x0;
    break;
  default:
    local_110 = (in_RDX->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    FinishPushdown(this,op);
    if (local_110 != (LogicalOperator *)0x0) {
      (*local_110->_vptr_LogicalOperator[1])();
    }
    local_110 = (LogicalOperator *)0x0;
    goto LAB_01187e1f;
  case 3:
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    if (pLVar5->type == LOGICAL_ASOF_JOIN) {
      local_e0 = (undefined1  [8])
                 (in_RDX->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RDX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      PushdownLeftJoin((FilterPushdown *)&local_120,op,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_e0,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&local_60);
      _Var3._M_head_impl = local_118._M_head_impl;
      local_118._M_head_impl = (LogicalOperator *)local_120;
      local_120 = (ClientContext *)0x0;
      if ((ClientContext *)_Var3._M_head_impl != (ClientContext *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                     &(_Var3._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      if (local_120 != (ClientContext *)0x0) {
        (*(code *)((*(ClientContext **)
                     &local_120->super_enable_shared_from_this<duckdb::ClientContext>)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      local_120 = (ClientContext *)0x0;
      if (local_e0 != (undefined1  [8])0x0) {
        (*(code *)(*(_Hash_node_base **)local_e0)[1]._M_nxt)();
      }
      local_e0 = (undefined1  [8])0x0;
    }
    else {
      local_f0._8_8_ =
           (in_RDX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RDX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      PushdownInnerJoin((FilterPushdown *)&local_120,op,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)(local_f0 + 8),
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&local_60);
      _Var3._M_head_impl = local_118._M_head_impl;
      local_118._M_head_impl = (LogicalOperator *)local_120;
      local_120 = (ClientContext *)0x0;
      if ((ClientContext *)_Var3._M_head_impl != (ClientContext *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                     &(_Var3._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      if (local_120 != (ClientContext *)0x0) {
        (*(code *)((*(ClientContext **)
                     &local_120->super_enable_shared_from_this<duckdb::ClientContext>)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      local_120 = (ClientContext *)0x0;
      if ((LogicalOperator *)local_f0._8_8_ != (LogicalOperator *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_f0._8_8_)[1]._M_nxt)();
      }
      local_f0._8_8_ = (_Hash_node_base *)0x0;
    }
    break;
  case 5:
  case 6:
    local_108 = (in_RDX->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownSemiAntiJoin((FilterPushdown *)&local_120,op);
    _Var3._M_head_impl = local_118._M_head_impl;
    local_118._M_head_impl = (LogicalOperator *)local_120;
    local_120 = (ClientContext *)0x0;
    if ((ClientContext *)_Var3._M_head_impl != (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                   &(_Var3._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (local_120 != (ClientContext *)0x0) {
      (*(code *)((*(ClientContext **)
                   &local_120->super_enable_shared_from_this<duckdb::ClientContext>)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    local_120 = (ClientContext *)0x0;
    if (local_108 != (LogicalOperator *)0x0) {
      (*local_108->_vptr_LogicalOperator[1])();
    }
    local_108 = (LogicalOperator *)0x0;
    break;
  case 7:
    local_100._8_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownMarkJoin((FilterPushdown *)&local_120,op,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)(local_100 + 8),
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&local_60);
    _Var3._M_head_impl = local_118._M_head_impl;
    local_118._M_head_impl = (LogicalOperator *)local_120;
    local_120 = (ClientContext *)0x0;
    if ((ClientContext *)_Var3._M_head_impl != (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                   &(_Var3._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (local_120 != (ClientContext *)0x0) {
      (*(code *)((*(ClientContext **)
                   &local_120->super_enable_shared_from_this<duckdb::ClientContext>)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    local_120 = (ClientContext *)0x0;
    if ((LogicalOperator *)local_100._8_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_100._8_8_)[1])();
    }
    local_100._8_8_ = (__buckets_ptr)0x0;
    break;
  case 8:
    local_100._0_8_ =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PushdownSingleJoin((FilterPushdown *)&local_120,op,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_100,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&local_60);
    _Var3._M_head_impl = local_118._M_head_impl;
    local_118._M_head_impl = (LogicalOperator *)local_120;
    local_120 = (ClientContext *)0x0;
    if ((ClientContext *)_Var3._M_head_impl != (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                   &(_Var3._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (local_120 != (ClientContext *)0x0) {
      (*(code *)((*(ClientContext **)
                   &local_120->super_enable_shared_from_this<duckdb::ClientContext>)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    local_120 = (ClientContext *)0x0;
    if ((LogicalOperator *)local_100._0_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_100._0_8_)[1])();
    }
    local_100._0_8_ = (pointer)0x0;
  }
  if ((char)iVar4 != '\0') {
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_118);
    if (((ulong)pLVar5->type < 0x39) &&
       ((0x138000000000000U >> ((ulong)pLVar5->type & 0x3f) & 1) != 0)) {
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&local_118);
      pvVar1 = *(void **)&pLVar5[1].type;
      *(void **)&pLVar5[1].type = local_b8;
      pLVar5[1].children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Stack_b0._M_nxt;
      pLVar5[1].children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_a8;
      local_b8 = (void *)0x0;
      _Stack_b0._M_nxt = (_Hash_node_base *)0x0;
      local_a8 = (pointer)0x0;
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1);
      }
      puVar2 = pLVar5[1].children.
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pLVar5[1].children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_d8;
      pLVar5[1].expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Stack_d0._M_nxt;
      pLVar5[1].expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8;
      local_d8 = (pointer)0x0;
      _Stack_d0._M_nxt = (__node_base_ptr)0x0;
      local_c8 = (__node_base_ptr)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
    }
  }
  this->optimizer = (Optimizer *)local_118._M_head_impl;
  local_118._M_head_impl = (LogicalOperator *)0x0;
LAB_01187e1f:
  if ((ClientContext *)local_118._M_head_impl != (ClientContext *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                 &(local_118._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_98);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownJoin(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN ||
	         op->type == LogicalOperatorType::LOGICAL_ASOF_JOIN || op->type == LogicalOperatorType::LOGICAL_ANY_JOIN ||
	         op->type == LogicalOperatorType::LOGICAL_DELIM_JOIN);
	auto &join = op->Cast<LogicalJoin>();

	const auto restore_projection_maps = join.HasProjectionMap();
	auto left_projection_map = join.left_projection_map;
	auto right_projection_map = join.right_projection_map;

	unordered_set<idx_t> left_bindings, right_bindings;
	LogicalJoin::GetTableReferences(*op->children[0], left_bindings);
	LogicalJoin::GetTableReferences(*op->children[1], right_bindings);

	unique_ptr<LogicalOperator> result;
	switch (join.join_type) {
	case JoinType::INNER:
		//	AsOf joins can't push anything into the RHS, so treat it as a left join
		if (op->type == LogicalOperatorType::LOGICAL_ASOF_JOIN) {
			result = PushdownLeftJoin(std::move(op), left_bindings, right_bindings);
			break;
		}
		result = PushdownInnerJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::LEFT:
		result = PushdownLeftJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::MARK:
		result = PushdownMarkJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::SINGLE:
		result = PushdownSingleJoin(std::move(op), left_bindings, right_bindings);
		break;
	case JoinType::SEMI:
	case JoinType::ANTI:
		result = PushdownSemiAntiJoin(std::move(op));
		break;
	default:
		// unsupported join type: stop pushing down
		return FinishPushdown(std::move(op));
	}

	if (restore_projection_maps) {
		switch (result->type) {
		case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		case LogicalOperatorType::LOGICAL_ANY_JOIN:
		case LogicalOperatorType::LOGICAL_DELIM_JOIN: {
			// Pushing down filter through join didn't change operator type (e.g., LogicalEmptyResult), restore maps
			auto &result_join = result->Cast<LogicalJoin>();
			result_join.left_projection_map = std::move(left_projection_map);
			result_join.right_projection_map = std::move(right_projection_map);
			break;
		}
		default:
			break;
		}
	}
	return result;
}